

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O3

int gdImageColorReplaceArray(gdImagePtr im,int len,int *src,int *dst)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  ulong __nmemb;
  int c;
  uint local_3c;
  void *local_38;
  
  if (src == dst || len < 1) {
    return 0;
  }
  if (len == 1) {
    iVar2 = gdImageColorReplace(im,*src,*dst);
    return iVar2;
  }
  iVar2 = overflow2(len,8);
  if (iVar2 != 0) {
    return -1;
  }
  __nmemb = (ulong)(uint)len;
  local_38 = gdMalloc(__nmemb * 8);
  if (local_38 == (void *)0x0) {
    return -1;
  }
  lVar5 = 0;
  lVar8 = 0;
  do {
    *(undefined4 *)((long)local_38 + (lVar5 >> 0x1e)) = *(undefined4 *)((long)src + lVar8 * 2);
    *(undefined4 *)((long)local_38 + (long)((int)lVar8 + 1) * 4) =
         *(undefined4 *)((long)dst + lVar8 * 2);
    lVar8 = lVar8 + 2;
    lVar5 = lVar5 + 0x200000000;
  } while (__nmemb * 2 != lVar8);
  qsort(local_38,__nmemb,8,colorCmp);
  iVar2 = im->cy1;
  iVar3 = im->cy2;
  pvVar4 = local_38;
  if (im->trueColor == 0) {
    if (iVar2 <= iVar3) {
      uVar6 = (ulong)(uint)im->cx2;
      iVar7 = 0;
      lVar5 = (long)iVar2;
      do {
        iVar2 = im->cx1;
        if (iVar2 <= (int)uVar6) {
          lVar8 = (long)iVar2 + -1;
          do {
            local_3c = (uint)im->pixels[lVar5][lVar8 + 1];
            pvVar4 = bsearch(&local_3c,pvVar4,__nmemb,8,colorCmp);
            if (pvVar4 != (void *)0x0) {
              gdImageSetPixel(im,iVar2,(int)lVar5,*(int *)((long)pvVar4 + 4));
              iVar7 = iVar7 + 1;
            }
            uVar6 = (ulong)im->cx2;
            lVar8 = lVar8 + 1;
            iVar2 = iVar2 + 1;
            pvVar4 = local_38;
          } while (lVar8 < (long)uVar6);
          iVar3 = im->cy2;
        }
        bVar1 = lVar5 < iVar3;
        lVar5 = lVar5 + 1;
      } while (bVar1);
      goto LAB_0010becd;
    }
  }
  else if (iVar2 <= iVar3) {
    uVar6 = (ulong)(uint)im->cx2;
    iVar7 = 0;
    lVar5 = (long)iVar2;
    do {
      iVar2 = im->cx1;
      if (iVar2 <= (int)uVar6) {
        lVar8 = (long)iVar2 + -1;
        do {
          local_3c = im->tpixels[lVar5][lVar8 + 1];
          pvVar4 = bsearch(&local_3c,pvVar4,__nmemb,8,colorCmp);
          if (pvVar4 != (void *)0x0) {
            gdImageSetPixel(im,iVar2,(int)lVar5,*(int *)((long)pvVar4 + 4));
            iVar7 = iVar7 + 1;
          }
          uVar6 = (ulong)im->cx2;
          lVar8 = lVar8 + 1;
          iVar2 = iVar2 + 1;
          pvVar4 = local_38;
        } while (lVar8 < (long)uVar6);
        iVar3 = im->cy2;
      }
      bVar1 = lVar5 < iVar3;
      lVar5 = lVar5 + 1;
    } while (bVar1);
    goto LAB_0010becd;
  }
  iVar7 = 0;
LAB_0010becd:
  gdFree(pvVar4);
  return iVar7;
}

Assistant:

BGD_DECLARE(int) gdImageColorReplaceArray (gdImagePtr im, int len, int *src, int *dst)
{
	register int x, y;
	int c, *d, *base;
	int i, n = 0;

	if (len <= 0 || src == dst) {
		return 0;
	}
	if (len == 1) {
		return gdImageColorReplace(im, src[0], dst[0]);
	}
	if (overflow2(len, sizeof(int)<<1)) {
		return -1;
	}
	base = (int *)gdMalloc(len * (sizeof(int)<<1));
	if (!base) {
		return -1;
	}
	for (i = 0; i < len; i++) {
		base[(i<<1)]   = src[i];
		base[(i<<1)+1] = dst[i];
	}
	qsort(base, len, sizeof(int)<<1, colorCmp);

#define REPLACING_LOOP(pixel) do {										\
		for (y = im->cy1; y <= im->cy2; y++) {							\
			for (x = im->cx1; x <= im->cx2; x++) {						\
				c = pixel(im, x, y);									\
				if ( (d = (int *)bsearch(&c, base, len, sizeof(int)<<1, colorCmp)) ) { \
					gdImageSetPixel(im, x, y, d[1]);					\
					n++;												\
				}														\
			}															\
		}																\
	} while (0)

	if (im->trueColor) {
		REPLACING_LOOP(gdImageTrueColorPixel);
	} else {
		REPLACING_LOOP(gdImagePalettePixel);
	}

#undef REPLACING_LOOP

	gdFree(base);
	return n;
}